

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

TestCaseGroup * vkt::SpirVAssembly::createOpCompositeInsertGroup(TestContext *testCtx)

{
  deUint32 dVar1;
  TestCaseGroup *pTVar2;
  SpvAsmComputeShaderCase *this;
  mapped_type *pmVar3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  NumberType type;
  pointer params;
  allocator<char> local_1b5;
  float local_1b4;
  TestContext *local_1b0;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> subGroup;
  string local_198;
  Random rnd;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  testCases;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  string description;
  string typeName;
  undefined1 local_f8 [88];
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
  local_a0 [24];
  int local_88 [22];
  
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  local_1b0 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,testCtx,"opcompositeinsert","Test the OpCompositeInsert instruction");
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar2;
  dVar1 = deStringHash((pTVar2->super_TestNode).m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar1);
  type = TYPE_INT;
  uVar4 = extraout_RDX;
  do {
    pTVar2 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data.ptr;
    if (type == TYPE_END) {
      group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
           = (TestCaseGroup *)0x0;
      de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
      ~UniqueBase(&group.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
      return pTVar2;
    }
    getNumberTypeName_abi_cxx11_(&typeName,(SpirVAssembly *)(ulong)type,(NumberType)uVar4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   "Test the OpCompositeInsert instruction with ",&typeName);
    std::operator+(&description,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,"s"
                  );
    std::__cxx11::string::~string((string *)local_f8);
    pTVar2 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar2,local_1b0,typeName._M_dataplus._M_p,description._M_dataplus._M_p);
    testCases.
    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    testCases.
    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    testCases.
    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    subGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    ptr = pTVar2;
    createCompositeCases(&testCases,&rnd,type);
    for (params = testCases.
                  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar2 = subGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr,
        params != testCases.
                  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; params = params + 1) {
      ComputeShaderSpec::ComputeShaderSpec((ComputeShaderSpec *)local_f8);
      specializeCompositeInsertShaderTemplate(&local_198,type,params);
      std::__cxx11::string::_M_assign((string *)local_f8);
      std::__cxx11::string::~string((string *)&local_198);
      if (type == TYPE_INT) {
        dVar1 = deRandom_getUint32(&rnd.m_rnd);
        createCompositeBuffer<int>((SpirVAssembly *)&local_198,dVar1);
        std::
        vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
        ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                  ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                    *)(local_f8 + 0x40),(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_198
                  );
        de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr
                  ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_198);
        createCompositeBuffer<int>((SpirVAssembly *)&local_198,dVar1);
        std::
        vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
        ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                  (local_a0,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_198);
LAB_00575e6c:
        de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr
                  ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_198);
      }
      else {
        if (type == TYPE_UINT) {
          dVar1 = deRandom_getUint32(&rnd.m_rnd);
          createCompositeBuffer<unsigned_int>((SpirVAssembly *)&local_198,dVar1);
          std::
          vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
          ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                    ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                      *)(local_f8 + 0x40),
                     (SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_198);
          de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr
                    ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_198);
          createCompositeBuffer<unsigned_int>((SpirVAssembly *)&local_198,dVar1);
          std::
          vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
          ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                    (local_a0,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_198);
          goto LAB_00575e6c;
        }
        if (type == TYPE_FLOAT) {
          local_1b4 = deRandom_getFloat(&rnd.m_rnd);
          createCompositeBuffer<float>((SpirVAssembly *)&local_198,local_1b4);
          std::
          vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
          ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                    ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                      *)(local_f8 + 0x40),
                     (SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_198);
          de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr
                    ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_198);
          createCompositeBuffer<float>((SpirVAssembly *)&local_198,local_1b4);
          std::
          vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
          ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
                    (local_a0,(SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&local_198);
          goto LAB_00575e6c;
        }
      }
      pTVar2 = subGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      local_88[0] = 1;
      local_88[1] = 1;
      local_88[2] = 1;
      this = (SpvAsmComputeShaderCase *)operator_new(0x140);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"name",&local_1b5);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::at(params,&local_198);
      SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
                (this,local_1b0,(pmVar3->_M_dataplus)._M_p,"OpCompositeInsert test",
                 (ComputeShaderSpec *)local_f8,COMPUTE_TEST_USES_NONE);
      tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)this);
      std::__cxx11::string::~string((string *)&local_198);
      ComputeShaderSpec::~ComputeShaderSpec((ComputeShaderSpec *)local_f8);
    }
    subGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                 .m_data.ptr)->super_TestNode,&pTVar2->super_TestNode);
    std::
    vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~vector(&testCases);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&subGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::~string((string *)&typeName);
    type = type + TYPE_UINT;
    uVar4 = extraout_RDX_00;
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createOpCompositeInsertGroup (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	group	(new tcu::TestCaseGroup(testCtx, "opcompositeinsert", "Test the OpCompositeInsert instruction"));
	de::Random						rnd		(deStringHash(group->getName()));

	for (int type = TYPE_INT; type != TYPE_END; ++type)
	{
		NumberType						numberType		= NumberType(type);
		const string					typeName		= getNumberTypeName(numberType);
		const string					description		= "Test the OpCompositeInsert instruction with " + typeName + "s";
		de::MovePtr<tcu::TestCaseGroup>	subGroup		(new tcu::TestCaseGroup(testCtx, typeName.c_str(), description.c_str()));
		vector<map<string, string> >	testCases;

		createCompositeCases(testCases, rnd, numberType);

		for (vector<map<string, string> >::const_iterator test = testCases.begin(); test != testCases.end(); ++test)
		{
			ComputeShaderSpec	spec;

			spec.assembly = specializeCompositeInsertShaderTemplate(numberType, *test);

			switch (numberType)
			{
				case TYPE_INT:
				{
					deInt32 number = getInt(rnd);
					spec.inputs.push_back(createCompositeBuffer<deInt32>(number));
					spec.outputs.push_back(createCompositeBuffer<deInt32>(number));
					break;
				}
				case TYPE_UINT:
				{
					deUint32 number = rnd.getUint32();
					spec.inputs.push_back(createCompositeBuffer<deUint32>(number));
					spec.outputs.push_back(createCompositeBuffer<deUint32>(number));
					break;
				}
				case TYPE_FLOAT:
				{
					float number = rnd.getFloat();
					spec.inputs.push_back(createCompositeBuffer<float>(number));
					spec.outputs.push_back(createCompositeBuffer<float>(number));
					break;
				}
				default:
					DE_ASSERT(false);
			}

			spec.numWorkGroups = IVec3(1, 1, 1);
			subGroup->addChild(new SpvAsmComputeShaderCase(testCtx, test->at("name").c_str(), "OpCompositeInsert test", spec));
		}
		group->addChild(subGroup.release());
	}
	return group.release();
}